

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackZIPGenerator.cxx
# Opt level: O1

void __thiscall cmCPackZIPGenerator::cmCPackZIPGenerator(cmCPackZIPGenerator *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"zip","");
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressNone,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackZIPGenerator_0060fcd8;
  return;
}

Assistant:

cmCPackZIPGenerator::cmCPackZIPGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressNone,
                           "zip")
{
}